

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_props.cpp
# Opt level: O0

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *rule,int32_t pos,int32_t limit,UnicodeString *pattern,
                  int32_t *parsedInts)

{
  int offset;
  UBool UVar1;
  char16_t cVar2;
  char16_t cVar3;
  int32_t iVar4;
  uint uVar5;
  int local_3c;
  UChar c;
  UChar cpat;
  int32_t i;
  int32_t intCount;
  int32_t p;
  int32_t *parsedInts_local;
  UnicodeString *pattern_local;
  int32_t limit_local;
  int32_t pos_local;
  UnicodeString *rule_local;
  
  _c = 0;
  local_3c = 0;
  _intCount = parsedInts;
  parsedInts_local = (int32_t *)pattern;
  pattern_local._0_4_ = limit;
  pattern_local._4_4_ = pos;
  _limit_local = rule;
  do {
    iVar4 = icu_63::UnicodeString::length((UnicodeString *)parsedInts_local);
    if (iVar4 <= local_3c) {
      return pattern_local._4_4_;
    }
    cVar2 = icu_63::UnicodeString::charAt((UnicodeString *)parsedInts_local,local_3c);
    offset = pattern_local._4_4_;
    if (cVar2 == L' ') {
      if ((int32_t)pattern_local <= pattern_local._4_4_) {
        return -1;
      }
      pattern_local._4_4_ = pattern_local._4_4_ + 1;
      cVar2 = icu_63::UnicodeString::charAt(_limit_local,offset);
      UVar1 = PatternProps::isWhiteSpace((uint)(ushort)cVar2);
      if (UVar1 == '\0') {
        return -1;
      }
LAB_004aaa80:
      pattern_local._4_4_ = skipWhitespace(_limit_local,(int32_t *)((long)&pattern_local + 4),'\0');
    }
    else if (cVar2 == L'#') {
      i = pattern_local._4_4_;
      iVar4 = parseInteger(_limit_local,&i,(int32_t)pattern_local);
      _intCount[_c] = iVar4;
      if (i == pattern_local._4_4_) {
        return -1;
      }
      pattern_local._4_4_ = i;
      _c = _c + 1;
    }
    else {
      if (cVar2 == L'~') goto LAB_004aaa80;
      if ((int32_t)pattern_local <= pattern_local._4_4_) {
        return -1;
      }
      pattern_local._4_4_ = pattern_local._4_4_ + 1;
      cVar3 = icu_63::UnicodeString::charAt(_limit_local,offset);
      uVar5 = u_tolower_63((uint)(ushort)cVar3);
      if ((uVar5 & 0xffff) != (uint)(ushort)cVar2) {
        return -1;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& rule, int32_t pos, int32_t limit,
                              const UnicodeString& pattern, int32_t* parsedInts) {
    // TODO Update this to handle surrogates
    int32_t p;
    int32_t intCount = 0; // number of integers parsed
    for (int32_t i=0; i<pattern.length(); ++i) {
        UChar cpat = pattern.charAt(i);
        UChar c;
        switch (cpat) {
        case 32 /*' '*/:
            if (pos >= limit) {
                return -1;
            }
            c = rule.charAt(pos++);
            if (!PatternProps::isWhiteSpace(c)) {
                return -1;
            }
            // FALL THROUGH to skipWhitespace
            U_FALLTHROUGH;
        case 126 /*'~'*/:
            pos = skipWhitespace(rule, pos);
            break;
        case 35 /*'#'*/:
            p = pos;
            parsedInts[intCount++] = parseInteger(rule, p, limit);
            if (p == pos) {
                // Syntax error; failed to parse integer
                return -1;
            }
            pos = p;
            break;
        default:
            if (pos >= limit) {
                return -1;
            }
            c = (UChar) u_tolower(rule.charAt(pos++));
            if (c != cpat) {
                return -1;
            }
            break;
        }
    }
    return pos;
}